

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O2

void rhash_sha1_final(sha1_ctx *ctx,uchar *result)

{
  uchar *puVar1;
  uint uVar2;
  ulong uVar4;
  ulong uVar5;
  int iVar3;
  
  uVar5 = (ulong)((uint)ctx->length & 0x3f);
  ctx->message[uVar5] = 0x80;
  while (uVar4 = uVar5 + 1, (uVar4 & 3) != 0) {
    ctx->message[uVar4] = '\0';
    uVar5 = uVar4;
  }
  if (uVar5 < 0x38) {
    uVar2 = (uint)(uVar4 >> 2) & 0x3fffffff;
  }
  else {
    if (uVar5 < 0x3f) {
      ctx->message[0x3c] = '\0';
      ctx->message[0x3d] = '\0';
      ctx->message[0x3e] = '\0';
      ctx->message[0x3f] = '\0';
    }
    rhash_sha1_process_block(ctx->hash,(uint *)ctx);
    uVar2 = 0;
  }
  for (uVar5 = (ulong)uVar2; uVar5 < 0xe; uVar5 = uVar5 + 1) {
    puVar1 = ctx->message + uVar5 * 4;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
  }
  uVar5 = ctx->length;
  uVar2 = (uint)(uVar5 >> 0x1d);
  *(uint *)(ctx->message + 0x38) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  iVar3 = (int)uVar5;
  uVar2 = iVar3 << 3;
  *(uint *)(ctx->message + 0x3c) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | iVar3 << 0x1b;
  rhash_sha1_process_block(ctx->hash,(uint *)ctx);
  if (result != (uchar *)0x0) {
    rhash_swap_copy_str_to_u32(result,0,ctx->hash,0x14);
    return;
  }
  return;
}

Assistant:

void rhash_sha1_final(sha1_ctx *ctx, unsigned char* result)
{
	unsigned  index = (unsigned)ctx->length & 63;
	unsigned* msg32 = (unsigned*)ctx->message;

	/* pad message and run for last block */
	ctx->message[index++] = 0x80;
	while ((index & 3) != 0) {
		ctx->message[index++] = 0;
	}
	index >>= 2;

	/* if no room left in the message to store 64-bit message length */
	if (index > 14) {
		/* then fill the rest with zeros and process it */
		while (index < 16) {
			msg32[index++] = 0;
		}
		rhash_sha1_process_block(ctx->hash, msg32);
		index = 0;
	}
	while (index < 14) {
		msg32[index++] = 0;
	}
	msg32[14] = be2me_32( (unsigned)(ctx->length >> 29) );
	msg32[15] = be2me_32( (unsigned)(ctx->length << 3) );
	rhash_sha1_process_block(ctx->hash, msg32);

	if (result) be32_copy(result, 0, &ctx->hash, sha1_hash_size);
}